

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::StoreInst::display(StoreInst *this,ostream *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar1;
  undefined8 extraout_RDX;
  
  poVar1 = std::operator<<(o,"store ");
  (**(this->val).super_Displayable._vptr_Displayable)(&this->val,poVar1);
  poVar1 = std::operator<<(poVar1," to ");
  UNRECOVERED_JUMPTABLE = *(this->super_Inst).dest.super_Displayable._vptr_Displayable;
  (*UNRECOVERED_JUMPTABLE)(&(this->super_Inst).dest,poVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void StoreInst::display(std::ostream& o) const {
  o << "store " << val << " to " << dest;
}